

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void int8_suite::test_zero(void)

{
  return_type rVar1;
  value_type input [2];
  decoder decoder;
  value local_64;
  undefined4 local_60;
  uchar local_5a [2];
  decoder local_58;
  
  local_5a[0] = 0xa0;
  local_5a[1] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[2]>(&local_58,&local_5a);
  local_64 = local_58.current.code;
  local_60 = 0xa0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa2,"void int8_suite::test_zero()",&local_64,&local_60);
  local_64 = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_60 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa3,"void int8_suite::test_zero()",&local_64,&local_60);
  local_64 = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_60 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa4,"void int8_suite::test_zero()",&local_64,&local_60);
  rVar1 = trial::protocol::bintoken::detail::decoder::
          overloader<trial::protocol::bintoken::token::int8>::decode(&local_58);
  local_60 = CONCAT31(local_60._1_3_,rVar1);
  local_64 = status;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,int>
            ("decoder.value<token::int8>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa5,"void int8_suite::test_zero()",&local_60,&local_64);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64 = local_58.current.code;
  local_60 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa7,"void int8_suite::test_zero()",&local_64,&local_60);
  return;
}

Assistant:

void test_zero()
{
    const value_type input[] = { token::code::int8, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int8>(), 0);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}